

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGenerator::AppendFeatureOptions
          (cmLocalGenerator *this,string *flags,string *lang,char *feature)

{
  cmMakefile *this_00;
  pointer pcVar1;
  cmValue cVar2;
  string *o;
  _Alloc_hider _Var3;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  cmList options;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  pointer local_70;
  undefined8 local_68;
  undefined8 local_60;
  char *local_58;
  undefined8 local_50;
  size_t local_48;
  char *local_40;
  undefined8 local_38;
  
  this_00 = this->Makefile;
  local_90._M_dataplus._M_p = (pointer)0x6;
  local_90._M_string_length = 0x823107;
  local_90.field_2._M_allocated_capacity = 0;
  local_70 = (lang->_M_dataplus)._M_p;
  local_90.field_2._8_8_ = lang->_M_string_length;
  local_68 = 0;
  local_60 = 0x11;
  local_58 = "_COMPILE_OPTIONS_";
  local_50 = 0;
  local_48 = strlen(feature);
  local_38 = 0;
  views._M_len = 4;
  views._M_array = (iterator)&local_90;
  local_40 = feature;
  cmCatViews(&local_b0,views);
  cVar2 = cmMakefile::GetDefinition(this_00,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (cVar2.Value != (string *)0x0) {
    pcVar1 = ((cVar2.Value)->_M_dataplus)._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar1,pcVar1 + (cVar2.Value)->_M_string_length);
    init._M_len = 1;
    init._M_array = &local_90;
    cmList::cmList((cmList *)&local_b0,init);
    _Var3._M_p = local_b0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      _Var3._M_p = local_b0._M_dataplus._M_p;
    }
    for (; _Var3._M_p != (pointer)local_b0._M_string_length; _Var3._M_p = _Var3._M_p + 0x20) {
      (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[9])(this,flags,_Var3._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_b0);
  }
  return;
}

Assistant:

void cmLocalGenerator::AppendFeatureOptions(std::string& flags,
                                            const std::string& lang,
                                            const char* feature)
{
  cmValue optionList = this->Makefile->GetDefinition(
    cmStrCat("CMAKE_", lang, "_COMPILE_OPTIONS_", feature));
  if (optionList) {
    cmList options{ *optionList };
    for (std::string const& o : options) {
      this->AppendFlagEscape(flags, o);
    }
  }
}